

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::StyledStreamWriter::writeIndent(StyledStreamWriter *this)

{
  ostream *poVar1;
  StyledStreamWriter *this_local;
  
  poVar1 = std::operator<<(this->document_,'\n');
  std::operator<<(poVar1,(string *)&this->indentString_);
  return;
}

Assistant:

void StyledStreamWriter::writeIndent() {
  /*
    Some comments in this method would have been nice. ;-)

   if ( !document_.empty() )
   {
      char last = document_[document_.length()-1];
      if ( last == ' ' )     // already indented
         return;
      if ( last != '\n' )    // Comments may add new-line
         *document_ << '\n';
   }
  */
  *document_ << '\n' << indentString_;
}